

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O0

void __thiscall
deci::parser_t::yy_print_<deci::parser_t::by_state>
          (parser_t *this,ostream *yyo,basic_symbol<deci::parser_t::by_state> *yysym)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  char *local_70;
  undefined1 local_50 [44];
  symbol_kind_type yykind;
  ostream *yyoutput;
  basic_symbol<deci::parser_t::by_state> *yysym_local;
  ostream *yyo_local;
  parser_t *this_local;
  
  unique0x10000110 = yyo;
  yyoutput = (ostream *)yysym;
  yysym_local = (basic_symbol<deci::parser_t::by_state> *)yyo;
  yyo_local = (ostream *)this;
  bVar1 = basic_symbol<deci::parser_t::by_state>::empty(yysym);
  if (bVar1) {
    std::operator<<((ostream *)yysym_local,"empty symbol");
  }
  else {
    local_50._36_4_ = by_state::kind((by_state *)yyoutput);
    if ((int)local_50._36_4_ < S_YYACCEPT) {
      local_70 = "token";
    }
    else {
      local_70 = "nterm";
    }
    poVar2 = std::operator<<((ostream *)yysym_local,local_70);
    poVar2 = std::operator<<(poVar2,' ');
    basic_symbol<deci::parser_t::by_state>::name_abi_cxx11_
              ((basic_symbol<deci::parser_t::by_state> *)local_50);
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    poVar2 = std::operator<<(poVar2," (");
    pbVar3 = operator<<(poVar2,(location *)(yyoutput + 0x40));
    std::operator<<(pbVar3,": ");
    std::__cxx11::string::~string((string *)local_50);
    std::operator<<((ostream *)yysym_local,')');
  }
  return;
}

Assistant:

void
   parser_t ::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        YY_USE (yykind);
        yyo << ')';
      }
  }